

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

void __thiscall c4::yml::detail::ReferenceResolver::store_anchors_and_refs(ReferenceResolver *this)

{
  size_t sVar1;
  stack<c4::yml::detail::ReferenceResolver::refdata,_16UL> *this_00;
  iterator prVar2;
  iterator prVar3;
  long in_RDI;
  Tree *unaff_retaddr;
  refdata *rd;
  iterator __end3;
  iterator __begin3;
  stack<c4::yml::detail::ReferenceResolver::refdata,_16UL> *__range3;
  size_t count;
  size_t prev_anchor;
  size_t num_anchors_and_refs;
  size_t in_stack_000001e0;
  ReferenceResolver *in_stack_000001e8;
  size_t in_stack_ffffffffffffffb8;
  stack<c4::yml::detail::ReferenceResolver::refdata,_16UL> *in_stack_ffffffffffffffc0;
  size_t in_stack_ffffffffffffffc8;
  ReferenceResolver *in_stack_ffffffffffffffd0;
  size_t local_28;
  size_t local_20;
  
  Tree::root_id(unaff_retaddr);
  sVar1 = count_anchors_and_refs(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  if (sVar1 != 0) {
    stack<c4::yml::detail::ReferenceResolver::refdata,_16UL>::reserve
              (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    Tree::root_id(unaff_retaddr);
    _store_anchors_and_refs(in_stack_000001e8,in_stack_000001e0);
    local_20 = 0xffffffffffffffff;
    local_28 = 0;
    this_00 = (stack<c4::yml::detail::ReferenceResolver::refdata,_16UL> *)(in_RDI + 8);
    prVar2 = stack<c4::yml::detail::ReferenceResolver::refdata,_16UL>::begin(this_00);
    prVar3 = stack<c4::yml::detail::ReferenceResolver::refdata,_16UL>::end(this_00);
    for (; prVar2 != prVar3; prVar2 = prVar2 + 1) {
      prVar2->prev_anchor = local_20;
      if (((prVar2->type).type & (VALANCH|KEYANCH)) != NOTYPE) {
        local_20 = local_28;
      }
      local_28 = local_28 + 1;
    }
  }
  return;
}

Assistant:

void store_anchors_and_refs()
    {
        // minimize (re-)allocations by counting first
        size_t num_anchors_and_refs = count_anchors_and_refs(t->root_id());
        if(!num_anchors_and_refs)
            return;
        refs.reserve(num_anchors_and_refs);

        // now descend through the hierarchy
        _store_anchors_and_refs(t->root_id());

        // finally connect the reference list
        size_t prev_anchor = npos;
        size_t count = 0;
        for(auto &rd : refs)
        {
            rd.prev_anchor = prev_anchor;
            if(rd.type.is_anchor())
                prev_anchor = count;
            ++count;
        }
    }